

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O3

void Cbs_SetDefaultParams(Cbs_Par_t *pPars)

{
  pPars->nBTThis = 0;
  pPars->nBTThisNc = 0;
  pPars->nJustThis = 0;
  pPars->nBTTotal = 0;
  pPars->nJustTotal = 0;
  pPars->nBTLimit = 1000;
  pPars->nJustLimit = 100;
  pPars->fUseHighest = 1;
  pPars->fUseLowest = 0;
  pPars->fUseMaxFF = 0;
  pPars->fVerbose = 1;
  return;
}

Assistant:

void Cbs_SetDefaultParams( Cbs_Par_t * pPars )
{
    memset( pPars, 0, sizeof(Cbs_Par_t) );
    pPars->nBTLimit    =  1000;   // limit on the number of conflicts
    pPars->nJustLimit  =   100;   // limit on the size of justification queue
    pPars->fUseHighest =     1;   // use node with the highest ID
    pPars->fUseLowest  =     0;   // use node with the highest ID
    pPars->fUseMaxFF   =     0;   // use node with the largest fanin fanout
    pPars->fVerbose    =     1;   // print detailed statistics
}